

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3MsrIncrNext
              (Fts3Table *p,Fts3MultiSegReader *pMsr,sqlite3_int64 *piDocid,char **paPoslist,
              int *pnPoslist)

{
  int nSegment;
  Fts3SegReader **ppFVar1;
  long lVar2;
  Fts3SegReader *pReader;
  int iVar3;
  Fts3SegReader **ppFVar4;
  code *xCmp;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  int nList;
  char *pList;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nSegment = pMsr->nAdvance;
  xCmp = fts3SegReaderDoclistCmpRev;
  if (p->bDescIdx == '\0') {
    xCmp = fts3SegReaderDoclistCmp;
  }
  if ((long)nSegment == 0) {
    *paPoslist = (char *)0x0;
  }
  else {
    ppFVar1 = pMsr->apSegment;
    ppFVar4 = ppFVar1;
    while ((*ppFVar4)->pOffsetList != (char *)0x0) {
      pList = &DAT_aaaaaaaaaaaaaaaa;
      nList = -0x55555556;
      lVar2 = (*ppFVar1)->iDocid;
      iVar3 = fts3SegReaderNextDocid(p,*ppFVar1,&pList,&nList);
      for (lVar6 = 1; (iVar3 == 0 && (lVar6 < nSegment)); lVar6 = lVar6 + 1) {
        pReader = ppFVar1[lVar6];
        if ((pReader->pOffsetList == (char *)0x0) || (pReader->iDocid != lVar2)) goto LAB_001b4488;
        iVar3 = fts3SegReaderNextDocid(p,pReader,(char **)0x0,(int *)0x0);
      }
      if (iVar3 != 0) goto LAB_001b452a;
LAB_001b4488:
      fts3SegReaderSort(pMsr->apSegment,nSegment,(int)lVar6,xCmp);
      iVar5 = nList;
      if ((0 < nList) && ((*ppFVar1)->ppNextElem != (Fts3HashElem **)0x0)) {
        iVar3 = fts3MsrBufferData(pMsr,pList,(ulong)(uint)nList + 1);
        if (iVar3 != 0) goto LAB_001b452a;
        pList = pMsr->aBuffer;
      }
      if (-1 < pMsr->iColFilter) {
        fts3ColumnFilter(pMsr->iColFilter,1,&pList,&nList);
        iVar5 = nList;
      }
      if (0 < iVar5) {
        *paPoslist = pList;
        *piDocid = lVar2;
        *pnPoslist = iVar5;
        goto LAB_001b4528;
      }
      ppFVar4 = pMsr->apSegment;
    }
    *paPoslist = (char *)0x0;
  }
LAB_001b4528:
  iVar3 = 0;
LAB_001b452a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3MsrIncrNext(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  sqlite3_int64 *piDocid,         /* OUT: Docid value */
  char **paPoslist,               /* OUT: Pointer to position list */
  int *pnPoslist                  /* OUT: Size of position list in bytes */
){
  int nMerge = pMsr->nAdvance;
  Fts3SegReader **apSegment = pMsr->apSegment;
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *) = (
    p->bDescIdx ? fts3SegReaderDoclistCmpRev : fts3SegReaderDoclistCmp
  );

  if( nMerge==0 ){
    *paPoslist = 0;
    return SQLITE_OK;
  }

  while( 1 ){
    Fts3SegReader *pSeg;
    pSeg = pMsr->apSegment[0];

    if( pSeg->pOffsetList==0 ){
      *paPoslist = 0;
      break;
    }else{
      int rc;
      char *pList;
      int nList;
      int j;
      sqlite3_int64 iDocid = apSegment[0]->iDocid;

      rc = fts3SegReaderNextDocid(p, apSegment[0], &pList, &nList);
      j = 1;
      while( rc==SQLITE_OK
        && j<nMerge
        && apSegment[j]->pOffsetList
        && apSegment[j]->iDocid==iDocid
      ){
        rc = fts3SegReaderNextDocid(p, apSegment[j], 0, 0);
        j++;
      }
      if( rc!=SQLITE_OK ) return rc;
      fts3SegReaderSort(pMsr->apSegment, nMerge, j, xCmp);

      if( nList>0 && fts3SegReaderIsPending(apSegment[0]) ){
        rc = fts3MsrBufferData(pMsr, pList, (i64)nList+1);
        if( rc!=SQLITE_OK ) return rc;
        assert( (pMsr->aBuffer[nList] & 0xFE)==0x00 );
        pList = pMsr->aBuffer;
      }

      if( pMsr->iColFilter>=0 ){
        fts3ColumnFilter(pMsr->iColFilter, 1, &pList, &nList);
      }

      if( nList>0 ){
        *paPoslist = pList;
        *piDocid = iDocid;
        *pnPoslist = nList;
        break;
      }
    }
  }

  return SQLITE_OK;
}